

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

bool save_png(char *pFilename,image_u8 *img,bool save_alpha)

{
  uint8_t uVar1;
  uint uVar2;
  const_reference __src;
  color_quad_u8 *pcVar3;
  byte in_DL;
  image_u8 *in_RSI;
  byte bVar4;
  uint32_t x;
  uint32_t y;
  uchar *pDst;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  uint32_t h;
  uint32_t w;
  uint32_t in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff5c;
  image_u8 *in_stack_ffffffffffffff60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff70;
  color_quad_u8_vec *in_stack_ffffffffffffff78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  uint local_58;
  uint local_54;
  uint8_t *local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  uint32_t local_1c;
  uint32_t local_18;
  byte local_11;
  image_u8 *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  local_18 = image_u8::width(in_RSI);
  local_1c = image_u8::height(local_10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x139074);
  if ((local_11 & 1) == 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
    local_50 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0);
    for (local_54 = 0; local_54 < local_1c; local_54 = local_54 + 1) {
      for (local_58 = 0; local_58 < local_18; local_58 = local_58 + 1) {
        pcVar3 = image_u8::operator()
                           (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                            in_stack_ffffffffffffff58);
        uVar1 = color_quad_u8::operator[](pcVar3,0);
        *local_50 = uVar1;
        pcVar3 = image_u8::operator()
                           (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                            in_stack_ffffffffffffff58);
        uVar1 = color_quad_u8::operator[](pcVar3,1);
        local_50[1] = uVar1;
        pcVar3 = image_u8::operator()
                           (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                            in_stack_ffffffffffffff58);
        uVar1 = color_quad_u8::operator[](pcVar3,2);
        local_50[2] = uVar1;
        local_50 = local_50 + 3;
      }
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff70 =
         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_38,0);
    in_stack_ffffffffffffff78 = image_u8::get_pixels(local_10);
    __src = std::vector<color_quad_u8,_std::allocator<color_quad_u8>_>::operator[]
                      (in_stack_ffffffffffffff78,0);
    memcpy(in_stack_ffffffffffffff70,__src,(ulong)(local_18 * local_1c) << 2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  uVar2 = lodepng::encode(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                          (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                          (uint)in_stack_ffffffffffffff78,
                          (LodePNGColorType)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                          (uint)in_stack_ffffffffffffff70);
  bVar4 = uVar2 == 0;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffff70);
  return (bool)(bVar4 & 1);
}

Assistant:

static bool save_png(const char *pFilename, const image_u8 &img, bool save_alpha)
{
	const uint32_t w = img.width();
	const uint32_t h = img.height();

	std::vector<unsigned char> pixels;
	if (save_alpha)
	{
		pixels.resize(w * h * sizeof(color_quad_u8));
		memcpy(&pixels[0], &img.get_pixels()[0], w * h * sizeof(color_quad_u8));
	}
	else
	{
		pixels.resize(w * h * 3);
		unsigned char *pDst = &pixels[0];
		for (uint32_t y = 0; y < h; y++)
			for (uint32_t x = 0; x < w; x++, pDst += 3)
				pDst[0] = img(x, y)[0], pDst[1] = img(x, y)[1], pDst[2] = img(x, y)[2];
	}
	
	return lodepng::encode(pFilename, pixels, w, h, save_alpha ? LCT_RGBA : LCT_RGB) == 0;
}